

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall google::protobuf::io::CodedInputStream::Refresh(CodedInputStream *this)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  LogFinisher local_ba;
  byte local_b9;
  LogMessage local_b8;
  int local_7c;
  uint8_t *puStack_78;
  int buffer_size;
  void *void_buffer;
  LogFinisher local_65;
  int current_position;
  byte local_51;
  LogMessage local_50;
  CodedInputStream *local_18;
  CodedInputStream *this_local;
  
  local_18 = this;
  iVar2 = BufferSize(this);
  local_51 = 0;
  if (iVar2 != 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x269);
    local_51 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (0) == (BufferSize()): ");
    internal::LogFinisher::operator=(&local_65,pLVar3);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (((this->buffer_size_after_limit_ < 1) && (this->overflow_bytes_ < 1)) &&
     (this->total_bytes_read_ != this->current_limit_)) {
    bVar1 = anon_unknown_1::NextNonEmpty(this->input_,&stack0xffffffffffffff88,&local_7c);
    if (bVar1) {
      this->buffer_ = puStack_78;
      this->buffer_end_ = this->buffer_ + local_7c;
      local_b9 = 0;
      if (local_7c < 0) {
        internal::LogMessage::LogMessage
                  (&local_b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                   ,0x27e);
        local_b9 = 1;
        pLVar3 = internal::LogMessage::operator<<(&local_b8,"CHECK failed: (buffer_size) >= (0): ");
        internal::LogFinisher::operator=(&local_ba,pLVar3);
      }
      if ((local_b9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_b8);
      }
      if (0x7fffffff - local_7c < this->total_bytes_read_) {
        this->overflow_bytes_ = this->total_bytes_read_ - (0x7fffffff - local_7c);
        this->buffer_end_ = this->buffer_end_ + -(long)this->overflow_bytes_;
        this->total_bytes_read_ = 0x7fffffff;
      }
      else {
        this->total_bytes_read_ = local_7c + this->total_bytes_read_;
      }
      RecomputeBufferLimits(this);
      this_local._7_1_ = true;
    }
    else {
      this->buffer_ = (uint8_t *)0x0;
      this->buffer_end_ = (uint8_t *)0x0;
      this_local._7_1_ = false;
    }
  }
  else {
    void_buffer._4_4_ = this->total_bytes_read_ - this->buffer_size_after_limit_;
    if ((this->total_bytes_limit_ <= void_buffer._4_4_) &&
       (this->total_bytes_limit_ != this->current_limit_)) {
      PrintTotalBytesLimitError(this);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CodedInputStream::Refresh() {
  GOOGLE_DCHECK_EQ(0, BufferSize());

  if (buffer_size_after_limit_ > 0 || overflow_bytes_ > 0 ||
      total_bytes_read_ == current_limit_) {
    // We've hit a limit.  Stop.
    int current_position = total_bytes_read_ - buffer_size_after_limit_;

    if (current_position >= total_bytes_limit_ &&
        total_bytes_limit_ != current_limit_) {
      // Hit total_bytes_limit_.
      PrintTotalBytesLimitError();
    }

    return false;
  }

  const void* void_buffer;
  int buffer_size;
  if (NextNonEmpty(input_, &void_buffer, &buffer_size)) {
    buffer_ = reinterpret_cast<const uint8_t*>(void_buffer);
    buffer_end_ = buffer_ + buffer_size;
    GOOGLE_CHECK_GE(buffer_size, 0);

    if (total_bytes_read_ <= INT_MAX - buffer_size) {
      total_bytes_read_ += buffer_size;
    } else {
      // Overflow.  Reset buffer_end_ to not include the bytes beyond INT_MAX.
      // We can't get that far anyway, because total_bytes_limit_ is guaranteed
      // to be less than it.  We need to keep track of the number of bytes
      // we discarded, though, so that we can call input_->BackUp() to back
      // up over them on destruction.

      // The following line is equivalent to:
      //   overflow_bytes_ = total_bytes_read_ + buffer_size - INT_MAX;
      // except that it avoids overflows.  Signed integer overflow has
      // undefined results according to the C standard.
      overflow_bytes_ = total_bytes_read_ - (INT_MAX - buffer_size);
      buffer_end_ -= overflow_bytes_;
      total_bytes_read_ = INT_MAX;
    }

    RecomputeBufferLimits();
    return true;
  } else {
    buffer_ = NULL;
    buffer_end_ = NULL;
    return false;
  }
}